

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint_tests.c
# Opt level: O2

TestSuite * constraint_tests(void)

{
  TestSuite *pTVar1;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("constraint_tests",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/constraint_tests.c"
                      ,0x11c);
  add_test_(pTVar1,"default_destroy_clears_state",
            &CgreenSpec__Constraint__default_destroy_clears_state__);
  add_test_(pTVar1,"parameter_name_matches_correctly",
            &CgreenSpec__Constraint__parameter_name_matches_correctly__);
  add_test_(pTVar1,"compare_contents_is_correct_on_larger_than_intptr_array",
            &CgreenSpec__Constraint__compare_contents_is_correct_on_larger_than_intptr_array__);
  add_test_(pTVar1,"compare_is_correct_when_using_integers",
            &CgreenSpec__Constraint__compare_is_correct_when_using_integers__);
  add_test_(pTVar1,"compare_to_is_null_correctly",
            &CgreenSpec__Constraint__compare_to_is_null_correctly__);
  add_test_(pTVar1,"string_constraint_destroy_clears_state",
            &CgreenSpec__Constraint__string_constraint_destroy_clears_state__);
  add_test_(pTVar1,"matching_strings_as_equal",&CgreenSpec__Constraint__matching_strings_as_equal__)
  ;
  add_test_(pTVar1,"matching_beginning_of_string",
            &CgreenSpec__Constraint__matching_beginning_of_string__);
  add_test_(pTVar1,"not_matching_beginning_of_string",
            &CgreenSpec__Constraint__not_matching_beginning_of_string__);
  add_test_(pTVar1,"matching_end_of_string",&CgreenSpec__Constraint__matching_end_of_string__);
  add_test_(pTVar1,"not_matching_end_of_string",
            &CgreenSpec__Constraint__not_matching_end_of_string__);
  add_test_(pTVar1,"matching_null_string_against_non_null_string",
            &CgreenSpec__Constraint__matching_null_string_against_non_null_string__);
  add_test_(pTVar1,"matching_against_null_string",
            &CgreenSpec__Constraint__matching_against_null_string__);
  add_test_(pTVar1,"matching_doubles_as_equal_with_default_significance",
            &CgreenSpec__Constraint__matching_doubles_as_equal_with_default_significance__);
  add_test_(pTVar1,"matching_doubles_respects_significant_figure_setting",
            &CgreenSpec__Constraint__matching_doubles_respects_significant_figure_setting__);
  add_test_(pTVar1,"compare_equal_to_contents_is_false_on_null",
            &CgreenSpec__Constraint__compare_equal_to_contents_is_false_on_null__);
  add_test_(pTVar1,"compare_not_equal_to_contents_is_false_on_null",
            &CgreenSpec__Constraint__compare_not_equal_to_contents_is_false_on_null__);
  add_test_(pTVar1,"can_compare_to_hex",&CgreenSpec__Constraint__can_compare_to_hex__);
  return pTVar1;
}

Assistant:

TestSuite *constraint_tests(void) {
    TestSuite *suite = create_test_suite();
    add_test_with_context(suite, Constraint, default_destroy_clears_state);
    add_test_with_context(suite, Constraint, parameter_name_matches_correctly);
    add_test_with_context(suite, Constraint, compare_contents_is_correct_on_larger_than_intptr_array);
    add_test_with_context(suite, Constraint, compare_is_correct_when_using_integers);
    add_test_with_context(suite, Constraint, compare_to_is_null_correctly);
    add_test_with_context(suite, Constraint, string_constraint_destroy_clears_state);
    add_test_with_context(suite, Constraint, matching_strings_as_equal);
    add_test_with_context(suite, Constraint, matching_beginning_of_string);
    add_test_with_context(suite, Constraint, not_matching_beginning_of_string);
    add_test_with_context(suite, Constraint, matching_end_of_string);
    add_test_with_context(suite, Constraint, not_matching_end_of_string);
    add_test_with_context(suite, Constraint, matching_null_string_against_non_null_string);
    add_test_with_context(suite, Constraint, matching_against_null_string);
    add_test_with_context(suite, Constraint, matching_doubles_as_equal_with_default_significance);
    add_test_with_context(suite, Constraint, matching_doubles_respects_significant_figure_setting);
    add_test_with_context(suite, Constraint, compare_equal_to_contents_is_false_on_null);
    add_test_with_context(suite, Constraint, compare_not_equal_to_contents_is_false_on_null);
    add_test_with_context(suite, Constraint, can_compare_to_hex);
//    add_test_with_context(suite, Constraint, unequal_structs_with_same_value_for_specific_field_compare_true);

    return suite;
}